

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.cpp
# Opt level: O3

void operator_delete__(void *ptr,size_t sz,align_val_t al)

{
  long lVar1;
  ulong uVar2;
  char *in_RCX;
  unsigned_long *unaff_RBX;
  char *in_R8;
  unsigned_long *in_R9;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + -0x20) != 0) {
    nodecpp::assert::
    nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)2,operator_delete_impl(void*,std::align_val_t)::_lambda()_1_,unsigned_long,unsigned_long>
              ((char *)al,(int)al,(anon_class_8_1_3fcf64e9 *)al,in_RCX,in_R8,in_R9,unaff_RBX);
    if (ptr != (void *)0x0) {
      lVar1 = *(long *)(in_FS_OFFSET + -0x20);
      if (((uint)ptr & 0xfff) == 0x20) {
        nodecpp::iibmalloc::
        BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_8388608UL,_(unsigned_short)32>::
        deallocate((BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_8388608UL,_(unsigned_short)32>
                    *)(lVar1 + 0x200),(void *)((ulong)ptr & 0xfffffffffffff000));
      }
      else {
        uVar2 = (ulong)((uint)((ulong)ptr >> 0xe) & 0x1f8);
        *(undefined8 *)ptr = *(undefined8 *)(lVar1 + uVar2);
        *(void **)(lVar1 + uVar2) = ptr;
      }
    }
    return;
  }
  nodecpp::assert::
  nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)2,operator_delete_impl(void*,std::align_val_t)::_lambda()_2_,unsigned_long,unsigned_long>
            ((char *)al,(int)al,(anon_class_8_1_3fcf64e9 *)0x20,in_RCX,in_R8,in_R9,unaff_RBX);
  free(ptr);
  return;
}

Assistant:

void operator delete[]( void* ptr, std::size_t sz, std::align_val_t al ) noexcept
{
	operator_delete_impl(ptr, al);
}